

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocketEngine_unix_p.cpp
# Opt level: O0

int __thiscall
BamTools::Internal::TcpSocketEngine::nativeSelect(TcpSocketEngine *this,int msecs,bool isRead)

{
  byte in_DL;
  int in_ESI;
  int *in_RDI;
  timeval tv;
  fd_set *__arr;
  uint __i;
  fd_set fds;
  timeval *local_e0;
  timeval *local_d0;
  timeval local_b8;
  fd_set *local_a8;
  uint local_9c;
  fd_set local_98;
  byte local_15;
  int local_14;
  int local_4;
  
  local_15 = in_DL & 1;
  local_a8 = &local_98;
  for (local_9c = 0; local_9c < 0x10; local_9c = local_9c + 1) {
    local_a8->fds_bits[local_9c] = 0;
  }
  local_14 = in_ESI;
  local_98.fds_bits[*in_RDI / 0x40] =
       1L << ((byte)((long)*in_RDI % 0x40) & 0x3f) | local_98.fds_bits[*in_RDI / 0x40];
  local_b8.tv_sec = (__time_t)(local_14 / 1000);
  local_b8.tv_usec = (__suseconds_t)((local_14 % 1000) * 1000);
  if ((local_15 & 1) == 0) {
    if (local_14 < 0) {
      local_e0 = (timeval *)0x0;
    }
    else {
      local_e0 = &local_b8;
    }
    local_4 = select(*in_RDI + 1,(fd_set *)0x0,&local_98,(fd_set *)0x0,local_e0);
  }
  else {
    if (local_14 < 0) {
      local_d0 = (timeval *)0x0;
    }
    else {
      local_d0 = &local_b8;
    }
    local_4 = select(*in_RDI + 1,&local_98,(fd_set *)0x0,(fd_set *)0x0,local_d0);
  }
  return local_4;
}

Assistant:

int TcpSocketEngine::nativeSelect(int msecs, bool isRead) const {

    // set up FD set
    fd_set fds;
    FD_ZERO(&fds);
    FD_SET(m_socketDescriptor, &fds);

    // setup our timeout
    timeval tv;
    tv.tv_sec  = msecs / 1000;
    tv.tv_usec = (msecs % 1000) * 1000;

    // do 'select'
    if ( isRead )
        return select(m_socketDescriptor + 1, &fds, 0, 0, (msecs < 0 ? 0 : &tv));
    else
        return select(m_socketDescriptor + 1, 0, &fds, 0, (msecs < 0 ? 0 : &tv));
}